

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
          (detail *this,basic_string_view<char> fmt,format_handler<char> *handler)

{
  format_args *this_00;
  detail *end;
  detail dVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  basic_appender<char> out;
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  basic_appender<char> out_02;
  detail *begin;
  int iVar2;
  format_handler<char> *this_01;
  basic_appender<char> bVar3;
  detail *end_00;
  format_specs specs;
  format_specs specs_00;
  longdouble in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_98;
  int local_88;
  format_specs local_78;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  id_adapter local_40;
  
  this_01 = (format_handler<char> *)fmt.size_;
  end = this + (long)fmt.data_;
  if (fmt.data_ != (char *)0x0) {
    this_00 = &(this_01->ctx).args_;
    end_00 = this;
    do {
      begin = end_00 + 1;
      if (*end_00 == (detail)0x7d) {
        if ((begin == end) || (*begin != (detail)0x7d)) {
          report_error("unmatched \'}\' in format string");
        }
        bVar3.container = (this_01->ctx).out_.container;
LAB_00133d38:
        copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                  ((char *)this,(char *)begin,bVar3);
        goto LAB_00133d41;
      }
      if (*end_00 == (detail)0x7b) {
        copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                  ((char *)this,(char *)end_00,(this_01->ctx).out_.container);
        if (begin == end) {
          report_error("invalid format string");
        }
        dVar1 = *begin;
        if (dVar1 == (detail)0x3a) {
          iVar2 = (this_01->parse_ctx).next_arg_id_;
          if (iVar2 < 0) {
LAB_001341b3:
            report_error("cannot switch from manual to automatic argument indexing");
          }
          (this_01->parse_ctx).next_arg_id_ = iVar2 + 1;
LAB_00133df2:
          begin = (detail *)
                  format_handler<char>::on_format_specs
                            (this_01,iVar2,(char *)(begin + 1),(char *)end);
          if ((begin == end) || (*begin != (detail)0x7d)) {
            report_error("unknown format specifier");
          }
LAB_00133e1a:
          begin = begin + 1;
          this = begin;
        }
        else {
          if (dVar1 == (detail)0x7b) {
            copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                      ((char *)begin,(char *)(end_00 + 2),(this_01->ctx).out_.container);
          }
          else {
            if (dVar1 != (detail)0x7d) {
              local_40.arg_id = 0;
              local_40.handler = this_01;
              begin = (detail *)
                      parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                                ((char *)begin,(char *)end,&local_40);
              if (begin == end) {
LAB_001341bf:
                report_error("missing \'}\' in format string");
              }
              iVar2 = local_40.arg_id;
              if (*begin == (detail)0x3a) goto LAB_00133df2;
              if (*begin != (detail)0x7d) goto LAB_001341bf;
              basic_format_args<fmt::v11::context>::get
                        ((format_arg *)&local_98.string,this_00,local_40.arg_id);
              if (0xe < local_88 - 1U) goto LAB_001341cb;
              bVar3.container = (this_01->ctx).out_.container;
              switch(local_88) {
              case 1:
                write<char,_fmt::v11::basic_appender<char>,_int,_0>(bVar3,local_98.int_value);
                break;
              case 2:
                write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                          (bVar3,local_98.uint_value);
                break;
              case 3:
                write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                          (bVar3,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
                break;
              case 4:
                write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                          (bVar3,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
                break;
              case 5:
                out_01.container._4_4_ = local_98.long_long_value._4_4_;
                out_01.container._0_4_ = local_98.int_value;
                value_01._10_6_ = in_stack_ffffffffffffff62;
                value_01._0_10_ = in_stack_ffffffffffffff58;
                write<char,_fmt::v11::basic_appender<char>,___int128,_0>
                          ((detail *)bVar3.container,out_01,(__int128)value_01);
                break;
              case 6:
                out_02.container._4_4_ = local_98.long_long_value._4_4_;
                out_02.container._0_4_ = local_98.int_value;
                value_02._10_6_ = in_stack_ffffffffffffff62;
                value_02._0_10_ = in_stack_ffffffffffffff58;
                write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                          ((detail *)bVar3.container,out_02,(unsigned___int128)value_02);
                break;
              case 7:
                local_78.super_basic_specs.data_ = 0x8000;
                local_78.super_basic_specs.fill_data_[0] = ' ';
                local_78.super_basic_specs.fill_data_[1] = '\0';
                local_78.super_basic_specs.fill_data_[2] = '\0';
                local_78.super_basic_specs.fill_data_[3] = '\0';
                local_78.width = 0;
                local_78.precision = -1;
                write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                          (bVar3,local_98.bool_value,&local_78,(locale_ref)0x0);
                break;
              case 8:
                write<char,fmt::v11::basic_appender<char>>(bVar3,local_98.char_value);
                break;
              case 9:
                write<char,_fmt::v11::basic_appender<char>,_float,_0>(bVar3,local_98.float_value);
                break;
              case 10:
                write<char,_fmt::v11::basic_appender<char>,_double,_0>
                          (bVar3,(double)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value)
                          );
                break;
              case 0xb:
                in_stack_ffffffffffffff58 =
                     (longdouble)
                     CONCAT28(local_98.int128_value._8_2_,
                              CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
                specs_00.width = 0;
                specs_00.precision = -1;
                specs_00.super_basic_specs.data_ = 0x8000;
                specs_00.super_basic_specs.fill_data_[0] = ' ';
                specs_00.super_basic_specs.fill_data_[1] = '\0';
                specs_00.super_basic_specs.fill_data_[2] = '\0';
                specs_00.super_basic_specs.fill_data_[3] = '\0';
                write_float<char,fmt::v11::basic_appender<char>,long_double>
                          (bVar3,in_stack_ffffffffffffff58,specs_00,(locale_ref)0x0);
                break;
              case 0xc:
                write<char,fmt::v11::basic_appender<char>>
                          (bVar3,(char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value)
                          );
                break;
              case 0xd:
                copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                          ((char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),
                           (char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value) +
                           CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_),bVar3)
                ;
                break;
              case 0xe:
                local_78.super_basic_specs.data_ = 0x8000;
                local_78.super_basic_specs.fill_data_[0] = ' ';
                local_78.super_basic_specs.fill_data_[1] = '\0';
                local_78.super_basic_specs.fill_data_[2] = '\0';
                local_78.super_basic_specs.fill_data_[3] = '\0';
                local_78.width = 0;
                local_78.precision = -1;
                write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                          (bVar3,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),
                           &local_78);
                break;
              case 0xf:
                local_58 = 0;
                uStack_50 = 0;
                local_48 = 0;
                local_78.super_basic_specs.data_ = (uint)bVar3.container;
                local_78.super_basic_specs.fill_data_ = SUB84((ulong)bVar3.container >> 0x20,0);
                local_78.width = 0;
                local_78.precision = 0;
                uStack_68 = 0;
                local_60 = 0;
                (*(code *)CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_))
                          (CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),&local_58,
                           &local_78);
              }
              goto LAB_00133e1a;
            }
            iVar2 = (this_01->parse_ctx).next_arg_id_;
            if (iVar2 < 0) goto LAB_001341b3;
            (this_01->parse_ctx).next_arg_id_ = iVar2 + 1;
            basic_format_args<fmt::v11::context>::get((format_arg *)&local_98.string,this_00,iVar2);
            if (0xe < local_88 - 1U) {
LAB_001341cb:
              report_error("argument not found");
            }
            bVar3.container = (this_01->ctx).out_.container;
            switch(local_88) {
            case 1:
              write<char,_fmt::v11::basic_appender<char>,_int,_0>(bVar3,local_98.int_value);
              break;
            case 2:
              write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                        (bVar3,local_98.uint_value);
              break;
            case 3:
              write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                        (bVar3,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
              break;
            case 4:
              write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                        (bVar3,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
              break;
            case 5:
              out.container._4_4_ = local_98.long_long_value._4_4_;
              out.container._0_4_ = local_98.int_value;
              value._10_6_ = in_stack_ffffffffffffff62;
              value._0_10_ = in_stack_ffffffffffffff58;
              write<char,_fmt::v11::basic_appender<char>,___int128,_0>
                        ((detail *)bVar3.container,out,(__int128)value);
              break;
            case 6:
              out_00.container._4_4_ = local_98.long_long_value._4_4_;
              out_00.container._0_4_ = local_98.int_value;
              value_00._10_6_ = in_stack_ffffffffffffff62;
              value_00._0_10_ = in_stack_ffffffffffffff58;
              write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                        ((detail *)bVar3.container,out_00,(unsigned___int128)value_00);
              break;
            case 7:
              local_78.super_basic_specs.data_ = 0x8000;
              local_78.super_basic_specs.fill_data_[0] = ' ';
              local_78.super_basic_specs.fill_data_[1] = '\0';
              local_78.super_basic_specs.fill_data_[2] = '\0';
              local_78.super_basic_specs.fill_data_[3] = '\0';
              local_78.width = 0;
              local_78.precision = -1;
              write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                        (bVar3,local_98.bool_value,&local_78,(locale_ref)0x0);
              break;
            case 8:
              write<char,fmt::v11::basic_appender<char>>(bVar3,local_98.char_value);
              break;
            case 9:
              write<char,_fmt::v11::basic_appender<char>,_float,_0>(bVar3,local_98.float_value);
              break;
            case 10:
              write<char,_fmt::v11::basic_appender<char>,_double,_0>
                        (bVar3,(double)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
              break;
            case 0xb:
              in_stack_ffffffffffffff58 =
                   (longdouble)
                   CONCAT28(local_98.int128_value._8_2_,
                            CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
              specs.width = 0;
              specs.precision = -1;
              specs.super_basic_specs.data_ = 0x8000;
              specs.super_basic_specs.fill_data_[0] = ' ';
              specs.super_basic_specs.fill_data_[1] = '\0';
              specs.super_basic_specs.fill_data_[2] = '\0';
              specs.super_basic_specs.fill_data_[3] = '\0';
              write_float<char,fmt::v11::basic_appender<char>,long_double>
                        (bVar3,in_stack_ffffffffffffff58,specs,(locale_ref)0x0);
              break;
            case 0xc:
              write<char,fmt::v11::basic_appender<char>>
                        (bVar3,(char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
              break;
            case 0xd:
              this = (detail *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value);
              begin = this + CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_);
              goto LAB_00133d38;
            case 0xe:
              local_78.super_basic_specs.data_ = 0x8000;
              local_78.super_basic_specs.fill_data_[0] = ' ';
              local_78.super_basic_specs.fill_data_[1] = '\0';
              local_78.super_basic_specs.fill_data_[2] = '\0';
              local_78.super_basic_specs.fill_data_[3] = '\0';
              local_78.width = 0;
              local_78.precision = -1;
              write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                        (bVar3,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),&local_78
                        );
              break;
            case 0xf:
              local_58 = 0;
              uStack_50 = 0;
              local_48 = 0;
              local_78.super_basic_specs.data_ = (uint)bVar3.container;
              local_78.super_basic_specs.fill_data_ = SUB84((ulong)bVar3.container >> 0x20,0);
              local_78.width = 0;
              local_78.precision = 0;
              uStack_68 = 0;
              local_60 = 0;
              (*(code *)CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_))
                        (CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),&local_58,
                         &local_78);
            }
          }
LAB_00133d41:
          begin = end_00 + 2;
          this = begin;
        }
      }
      end_00 = begin;
    } while (begin != end);
  }
  copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
            ((char *)this,(char *)end,(this_01->ctx).out_.container);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}